

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

BOOL __thiscall
Js::CustomExternalWrapperObject::HasOwnItem(CustomExternalWrapperObject *this,uint32 index)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  Var aValue;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  HostScriptContext *pHVar6;
  JavascriptFunction *function;
  RecyclableObject *ptr;
  anon_class_48_6_c05621ac local_68;
  JavascriptBoolean *local_38;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar6 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar6->scriptContext;
  BVar5 = EnsureInitialized(this,pSVar2);
  if (BVar5 == 0) {
    return 0;
  }
  aValue = *(Var *)&((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.
                    ptr)->elements[2].field_0x8;
  if (aValue == (Var)0x0) {
LAB_00a0ffb2:
    BVar5 = DynamicObject::HasOwnItem(&this->super_DynamicObject,index);
    return BVar5;
  }
  function = VarTo<Js::JavascriptFunction>(aValue);
  if (function == (JavascriptFunction *)0x0) goto LAB_00a0ffb2;
  bVar3 = ScriptContext::IsHeapEnumInProgress(pSVar2);
  if (bVar3) goto LAB_00a0ffb2;
  local_38 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             booleanTrue.ptr;
  local_68.propertyNameNumericValue = JavascriptNumber::ToVar(index,pSVar2);
  local_68.propertyName = (Var)0x0;
  local_68.isPropertyNameNumeric = local_38;
  bVar3 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_68.threadContext = this_00;
  local_68.hasMethod = function;
  local_68.targetObj = (RecyclableObject *)this;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar4 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar4) {
    ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_68);
    bVar4 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00a100ae;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_68);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00a100ae;
    }
    ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_68);
    bVar4 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar4 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00a100ae:
  this_00->reentrancySafeOrHandled = bVar3;
  BVar5 = JavascriptConversion::ToBoolean(ptr,pSVar2);
  return BVar5;
}

Assistant:

BOOL CustomExternalWrapperObject::HasOwnItem(uint32 index)
{
    auto fn = [&](Js::RecyclableObject* object)-> BOOL {
        return DynamicObject::HasOwnItem(index);
    };
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        *isPropertyNameNumeric = requestContext->GetLibrary()->GetTrue();
        *propertyNameNumericValue = JavascriptNumber::ToVar(index, requestContext);
        return nullptr;
    };

    return HasPropertyTrap(fn, getPropertyName, nullptr);
}